

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

double __thiscall
soplex::SPxScaler<double>::rhsUnscaled(SPxScaler<double> *this,SPxLPBase<double> *lp,int i)

{
  double __x;
  double *pdVar1;
  double dVar2;
  
  dVar2 = (lp->super_LPRowSetBase<double>).right.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[i];
  pdVar1 = (double *)infinity();
  __x = (lp->super_LPRowSetBase<double>).right.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [i];
  if (dVar2 < *pdVar1) {
    dVar2 = ldexp(__x,-(lp->super_LPRowSetBase<double>).scaleExp.data[i]);
    return dVar2;
  }
  return __x;
}

Assistant:

R SPxScaler<R>::rhsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(lp.isScaled());
   assert(i < lp.nRows());
   assert(i >= 0);

   if(lp.LPRowSetBase<R>::rhs(i) < R(infinity))
   {
      const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
      return spxLdexp(lp.LPRowSetBase<R>::rhs(i), -rowscaleExp[i]);
   }
   else
      return lp.LPRowSetBase<R>::rhs(i);
}